

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O2

void play_game(game_mode_type mode)

{
  uint32_t *puVar1;
  char *pcVar2;
  player *p;
  term *t;
  savefile_getter psVar3;
  _Bool _Var4;
  byte bVar5;
  char **entries;
  char **entries_00;
  long lVar6;
  menu_iter *iter;
  menu *menu;
  ulong uVar7;
  undefined8 extraout_RDX;
  long lVar8;
  wchar_t wVar9;
  char *pcVar10;
  uint uVar11;
  wchar_t wVar12;
  ulong uVar13;
  bool bVar14;
  ui_event uVar15;
  int local_6c;
  savefile_getter g;
  undefined8 local_58;
  game_mode_type local_4c;
  region local_48;
  char *local_38;
  
  local_4c = mode;
  do {
    play_again = false;
    if (local_4c < GAME_SELECT) {
      _Var4 = start_game(local_4c == GAME_NEW);
      pcVar10 = "Broken savefile";
      if (!_Var4) {
LAB_001c289d:
        quit(pcVar10);
      }
    }
    else {
      pcVar10 = "Invalid game mode in play_game()";
      if (local_4c != GAME_SELECT) goto LAB_001c289d;
      local_58 = 0;
      pcVar10 = "";
      do {
        g = (savefile_getter)0x0;
        local_38 = pcVar10;
        entries = (char **)mem_zalloc(0x80);
        entries_00 = (char **)mem_zalloc(0x80);
        local_48.col = 0;
        local_48.row = 3;
        local_48.width = 0;
        local_48.page_rows = 0;
        lVar8 = 0;
        uVar13 = 1;
        local_6c = 0;
        uVar11 = 0x10;
        while (_Var4 = got_savefile(&g), psVar3 = g, _Var4) {
          if ((g == (savefile_getter)0x0) || (g->have_details == false)) {
            __assert_fail("details",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x304,"void select_savefile(_Bool, _Bool *)");
          }
          if (uVar13 == uVar11) {
            uVar11 = uVar11 * 2;
            entries = (char **)mem_realloc(entries,(long)(int)uVar11 << 3);
            entries_00 = (char **)mem_realloc(entries_00,(long)(int)uVar11 << 3);
          }
          pcVar10 = (psVar3->details).fnam + (psVar3->details).foff;
          if ((psVar3->details).desc == (char *)0x0) {
            pcVar10 = format("Use %s",pcVar10);
          }
          else {
            pcVar10 = format("Use %s: %s",pcVar10);
          }
          pcVar10 = string_make(pcVar10);
          entries[uVar13] = pcVar10;
          pcVar10 = string_make((psVar3->details).fnam);
          entries_00[uVar13] = pcVar10;
          _Var4 = suffix(savefile,(psVar3->details).fnam);
          if (_Var4) {
            if (uVar13 != 1) {
              pcVar10 = entries[uVar13];
              pcVar2 = entries_00[uVar13];
              for (uVar7 = uVar13; 1 < (long)uVar7; uVar7 = uVar7 - 1) {
                entries[uVar7] = entries[uVar7 - 1];
                entries_00[uVar7] = entries_00[uVar7 - 1];
              }
              entries[1] = pcVar10;
              entries_00[1] = pcVar2;
            }
            local_6c = 1;
            if (arg_force_name == false) {
              savefile[0] = '\0';
              arg_name[0] = '\0';
              local_6c = 1;
            }
          }
          uVar13 = uVar13 + 1;
          lVar8 = lVar8 + 1;
        }
        if ((g == (savefile_getter)0x0) || (g->have_savedir != true)) {
          bVar14 = false;
LAB_001c271b:
          bVar5 = 0;
        }
        else {
          if (((int)uVar11 < 1) || (*entries != (char *)0x0)) {
            __assert_fail("allocated > 0 && !entries[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x330,"void select_savefile(_Bool, _Bool *)");
          }
          if ((local_6c == 0) || (arg_force_name != true)) {
            pcVar10 = string_make("New game");
            *entries = pcVar10;
            bVar14 = true;
            goto LAB_001c271b;
          }
          if (*entries_00 != (char *)0x0) {
            __assert_fail("!entries[0] && !names[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x338,"void select_savefile(_Bool, _Bool *)");
          }
          lVar6 = 1;
          while (bVar14 = lVar8 != 0, lVar8 = lVar8 + -1, bVar14) {
            entries[lVar6 + -1] = entries[lVar6];
            entries_00[lVar6 + -1] = entries_00[lVar6];
            lVar6 = lVar6 + 1;
          }
          uVar13 = (ulong)((int)uVar13 - 1);
          local_6c = 0;
          bVar14 = true;
          bVar5 = 1;
        }
        cleanup_savefile_getter(g);
        wVar12 = (wchar_t)uVar13;
        if (!bVar14) {
          cleanup_savefile_selection_strings(entries_00,wVar12);
          cleanup_savefile_selection_strings(entries,wVar12);
          quit("Cannot open the savefile directory");
        }
        iter = menu_find_iter(MN_ITER_STRINGS);
        menu = menu_new(MN_SKIN_SCROLL,iter);
        menu_setpriv(menu,wVar12,entries);
        menu_layout(menu,&local_48);
        menu->cursor = local_6c;
        *(byte *)&menu->flags = (byte)menu->flags | 0x10;
        screen_save();
        prt("Select the save to use (movement keys and enter or mouse) or quit",L'\0',L'\0');
        prt("(escape or second mouse button).",L'\x01',L'\0');
        prt(local_38,L'\x02',L'\0');
        uVar15 = menu_select(menu,0,false);
        screen_load();
        if (uVar15.type == EVT_SELECT) {
          wVar9 = menu->cursor;
          local_58 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          if (!(bool)(~bVar5 & (ulong)(uint)wVar9 == 0)) {
            if ((wVar9 < L'\x01') || (wVar12 <= wVar9)) {
              __assert_fail("m->cursor > 0 && m->cursor < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                            ,0x362,"void select_savefile(_Bool, _Bool *)");
            }
            path_build(savefile,0x400,ANGBAND_DIR_SAVE,entries_00[(uint)wVar9]);
            local_58 = 0;
          }
        }
        menu_free(menu);
        cleanup_savefile_selection_strings(entries_00,wVar12);
        cleanup_savefile_selection_strings(entries,wVar12);
        if (uVar15.type == EVT_ESCAPE) {
          quit((char *)0x0);
        }
        _Var4 = start_game((_Bool)((byte)local_58 & 1));
        pcVar10 = "The previously selected savefile was unusable.";
      } while (!_Var4);
    }
    while ((t = Term, p = player, player->is_dead == false && (player->upkeep->playing == true))) {
      if (character_dungeon == true) {
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0xc18000;
        handle_stuff(p);
        if (((player->opts).opt[8] == true) && (_Var4 = target_sighted(), _Var4)) {
          target_get((loc_conflict *)&local_48);
          wVar12 = local_48.col;
          wVar9 = local_48.row;
        }
        else {
          wVar12 = (player->grid).x;
          wVar9 = (player->grid).y;
        }
        move_cursor_relative(wVar9,wVar12);
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          if (angband_term[lVar8] != (term *)0x0) {
            Term_activate(angband_term[lVar8]);
            Term_fresh();
          }
        }
      }
      Term_activate(t);
      (*cmd_get_hook)(CTX_GAME);
      run_game_loop();
    }
    close_game(true);
    if (play_again != true) {
      return;
    }
    cleanup_angband();
    init_display();
    init_angband();
    if (reinit_hook != (_func_void *)0x0) {
      (*reinit_hook)();
    }
    textui_init();
    local_4c = local_4c + (local_4c == GAME_LOAD);
  } while( true );
}

Assistant:

void play_game(enum game_mode_type mode)
{
	while (1) {
		play_again = false;

		/* Load a savefile or birth a character, or both */
		switch (mode) {
		case GAME_LOAD:
		case GAME_NEW:
			if (!start_game(mode == GAME_NEW)) {
				quit("Broken savefile");
			}
			break;

		case GAME_SELECT:
			{
				bool new_game = false, retry = false;

				while (1) {
					select_savefile(retry, &new_game);
					if (start_game(new_game)) {
						break;
					}
					retry = true;
				}
			}
			break;

		default:
			quit("Invalid game mode in play_game()");
			break;
		}

		/* Get commands from the user, then process the game world
		 * until the command queue is empty and a new player command
		 * is needed */
		while (!player->is_dead && player->upkeep->playing) {
			pre_turn_refresh();
			cmd_get_hook(CTX_GAME);
			run_game_loop();
		}

		/* Close game on death or quitting */
		close_game(true);

		if (!play_again) break;

		cleanup_angband();
		init_display();
		init_angband();
		if (reinit_hook != NULL) {
			(*reinit_hook)();
		}
		textui_init();
		if (mode == GAME_LOAD) {
			mode = GAME_NEW;
		}
	}
}